

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v9::detail::digit_grouping<char>::digit_grouping
          (digit_grouping<char> *this,locale_ref loc,bool localized)

{
  locale_ref loc_00;
  byte bVar1;
  byte in_DL;
  thousands_sep_result<char> *in_RDI;
  thousands_sep_result<char> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  thousands_sep_result<char>::thousands_sep_result((thousands_sep_result<char> *)0x1bc965);
  if ((bVar1 & 1) == 0) {
    in_RDI->thousands_sep = '\0';
  }
  else {
    loc_00.locale_._7_1_ = bVar1;
    loc_00.locale_._0_7_ = in_stack_ffffffffffffffe8;
    thousands_sep<char>(loc_00);
    thousands_sep_result<char>::operator=(in_RDI,in_stack_ffffffffffffff98);
    thousands_sep_result<char>::~thousands_sep_result((thousands_sep_result<char> *)0x1bc9a0);
  }
  return;
}

Assistant:

explicit digit_grouping(locale_ref loc, bool localized = true) {
    if (localized)
      sep_ = thousands_sep<Char>(loc);
    else
      sep_.thousands_sep = Char();
  }